

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-reader-ir.cc
# Opt level: O1

Result __thiscall
wabt::anon_unknown_78::BinaryReaderIR::OnInitExprRefFunc
          (BinaryReaderIR *this,Index index,Index func_index)

{
  char *__s;
  Offset OVar1;
  ExprList *pEVar2;
  Expr *pEVar3;
  size_t sVar4;
  Expr *pEVar5;
  ExprList *pEVar6;
  Location loc;
  Location local_88;
  Var local_68;
  
  local_88.field_1.field_0.line = 0;
  local_88.field_1.field_0.first_column = 0;
  local_88.field_1.field_0.last_column = 0;
  local_88.filename.data_ = (char *)0x0;
  local_88.filename.size_._0_4_ = 0;
  local_88.filename.size_._4_4_ = 0;
  __s = this->filename_;
  sVar4 = strlen(__s);
  local_88.filename.size_._0_4_ = (undefined4)sVar4;
  local_88.filename.size_._4_4_ = (undefined4)(sVar4 >> 0x20);
  OVar1 = ((this->super_BinaryReaderNop).super_BinaryReaderDelegate.state)->offset;
  local_88.field_1.field_0.line = (int)OVar1;
  local_88.field_1.field_0.first_column = (int)(OVar1 >> 0x20);
  pEVar2 = this->current_init_expr_;
  local_88.filename.data_ = __s;
  Var::Var(&local_68,func_index,&local_88);
  pEVar5 = (Expr *)operator_new(0x88);
  (pEVar5->super_intrusive_list_base<wabt::Expr>).next_ = (Expr *)0x0;
  (pEVar5->super_intrusive_list_base<wabt::Expr>).prev_ = (Expr *)0x0;
  pEVar5->_vptr_Expr = (_func_int **)&PTR__Expr_001999b0;
  (pEVar5->loc).filename.data_ = local_88.filename.data_;
  (pEVar5->loc).filename.size_ =
       CONCAT44(local_88.filename.size_._4_4_,(undefined4)local_88.filename.size_);
  (pEVar5->loc).field_1.field_1.offset =
       CONCAT44(local_88.field_1.field_0.first_column,local_88.field_1.field_0.line);
  *(ulong *)((long)&(pEVar5->loc).field_1 + 8) =
       CONCAT44(local_88.field_1._12_4_,local_88.field_1.field_0.last_column);
  pEVar5->type_ = RefFunc;
  pEVar5->_vptr_Expr = (_func_int **)&PTR__VarExpr_0019a5d8;
  Var::Var((Var *)(pEVar5 + 1),&local_68);
  if (((pEVar5->super_intrusive_list_base<wabt::Expr>).prev_ == (Expr *)0x0) &&
     ((pEVar5->super_intrusive_list_base<wabt::Expr>).next_ == (Expr *)0x0)) {
    pEVar3 = pEVar2->last_;
    pEVar6 = pEVar2;
    if (pEVar3 != (Expr *)0x0) {
      (pEVar5->super_intrusive_list_base<wabt::Expr>).prev_ = pEVar3;
      pEVar6 = (ExprList *)&pEVar3->super_intrusive_list_base<wabt::Expr>;
    }
    pEVar6->first_ = pEVar5;
    pEVar2->last_ = pEVar5;
    pEVar2->size_ = pEVar2->size_ + 1;
    Var::~Var(&local_68);
    return (Result)Ok;
  }
  __assert_fail("node->prev_ == nullptr && node->next_ == nullptr",
                "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]wabt/src/intrusive-list.h"
                ,0x1bf,
                "void wabt::intrusive_list<wabt::Expr>::push_back(std::unique_ptr<T>) [T = wabt::Expr]"
               );
}

Assistant:

Result BinaryReaderIR::OnInitExprRefFunc(Index index, Index func_index) {
  Location loc = GetLocation();
  current_init_expr_->push_back(
      MakeUnique<RefFuncExpr>(Var(func_index, loc), loc));
  return Result::Ok;
}